

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListTest_insert_pointer_Test::TestBody(IntrusiveListTest_insert_pointer_Test *this)

{
  TestObject *pTVar1;
  vector<int,_std::allocator<int>_> *expected;
  iterator iVar2;
  iterator pos;
  iterator pos_00;
  iterator __x;
  TestObjectList local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  wabt local_68 [8];
  wabt local_60 [8];
  wabt local_58 [8];
  wabt local_50 [8];
  TestObjectList list;
  
  list.size_ = 0;
  list.first_ = (TestObject *)0x0;
  list.last_ = (TestObject *)0x0;
  local_98.first_._0_4_ = 2;
  wabt::MakeUnique<(anonymous_namespace)::TestObject,int>(local_50,(int *)&local_98);
  iVar2.node_ = (TestObject *)0x0;
  iVar2.list_ = &list;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::insert
            (&list,iVar2,
             (unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
              *)local_50);
  std::
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
                 *)local_50);
  local_98.first_._0_4_ = 4;
  wabt::MakeUnique<(anonymous_namespace)::TestObject,int>(local_58,(int *)&local_98);
  pos.node_ = (TestObject *)0x0;
  pos.list_ = &list;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::insert
            (&list,pos,
             (unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
              *)local_58);
  std::
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
                 *)local_58);
  __x.node_ = list.first_;
  __x.list_ = &list;
  iVar2 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>(__x,1);
  local_98.first_._0_4_ = 3;
  wabt::MakeUnique<(anonymous_namespace)::TestObject,int>(local_60,(int *)&local_98);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::insert
            (&list,iVar2,
             (unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
              *)local_60);
  std::
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
                 *)local_60);
  pTVar1 = list.first_;
  local_98.first_ = (TestObject *)CONCAT44(local_98.first_._4_4_,1);
  wabt::MakeUnique<(anonymous_namespace)::TestObject,int>(local_68,(int *)&local_98);
  pos_00.node_ = pTVar1;
  pos_00.list_ = &list;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::insert
            (&list,pos_00,
             (unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
              *)local_68);
  std::
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
                 *)local_68);
  local_78 = 0x200000001;
  uStack_70 = 0x400000003;
  local_98.first_ = (TestObject *)0x0;
  local_98.last_ = (TestObject *)0x0;
  local_98.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_98,&local_78);
  anon_unknown.dwarf_6462d::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list,&local_98,expected);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_98);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, insert_pointer) {
  TestObjectList list;

  list.insert(list.begin(), MakeUnique<TestObject>(2));
  list.insert(list.end(), MakeUnique<TestObject>(4));
  list.insert(std::next(list.begin()), MakeUnique<TestObject>(3));
  list.insert(list.begin(), MakeUnique<TestObject>(1));

  AssertListEq(list, {1, 2, 3, 4});
}